

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsMakeSpanVectorForcedImmutableFromConst(void)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  initializer_list<int> __l;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> values;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 2;
  local_18[2] = 3;
  local_18[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,&local_31);
  lVar2 = (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start >> 2;
  if (lVar2 == 4) {
    iVar3 = 0;
    if (values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0 ||
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) goto LAB_001749ad;
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x51);
    poVar1 = std::operator<<(poVar1,": error: ");
    pcVar4 = "(span.Data()) == (values.data())";
  }
  else if (lVar2 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x4f);
    poVar1 = std::operator<<(poVar1,": error: ");
    pcVar4 = "!span.IsEmpty()";
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x50);
    poVar1 = std::operator<<(poVar1,": error: ");
    pcVar4 = "(span.Size()) == (size_t(4))";
  }
  poVar1 = std::operator<<(poVar1,pcVar4);
  poVar1 = std::operator<<(poVar1," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar3 = 1;
LAB_001749ad:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return iVar3;
}

Assistant:

int testSpanTestsMakeSpanVectorForcedImmutableFromConst()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan<const int>(values);
    static_assert(std::is_same<decltype(span)::value_type, decltype(span)::const_value_type>::value,
                  "MakeSpan should make const T");

    ML_ASSERT(!span.IsEmpty());
    ML_ASSERT_EQ(span.Size(), size_t(4));
    ML_ASSERT_EQ(span.Data(), values.data());

    return 0;
}